

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O2

void work_gga_vxc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double __x;
  double dVar34;
  double dVar35;
  double dVar36;
  double __x_00;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double __x_01;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double __x_02;
  double dVar64;
  undefined1 auVar65 [16];
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  undefined1 auVar124 [16];
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double local_618;
  double local_5f0;
  double local_2f8;
  
  for (sVar17 = 0; np != sVar17; sVar17 = sVar17 + 1) {
    lVar16 = (long)(p->dim).rho * sVar17;
    dVar50 = rho[lVar16];
    if (p->nspin == 2) {
      dVar50 = dVar50 + rho[lVar16 + 1];
    }
    dVar47 = p->dens_threshold;
    if (dVar47 <= dVar50) {
      dVar50 = rho[lVar16];
      if (rho[lVar16] <= dVar47) {
        dVar50 = dVar47;
      }
      dVar66 = p->sigma_threshold * p->sigma_threshold;
      dVar1 = sigma[(long)(p->dim).sigma * sVar17];
      pdVar9 = (double *)p->params;
      dVar75 = p->zeta_threshold;
      bVar10 = dVar75 < 1.0;
      bVar11 = dVar47 < dVar50 * 0.5;
      dVar19 = cbrt(0.3183098861837907);
      dVar20 = dVar19 * 1.4422495703074083;
      dVar21 = dVar20 * 2.519842099789747;
      dVar22 = cbrt(dVar75);
      dVar51 = dVar75 * dVar22;
      dVar47 = dVar51;
      if (dVar75 < 2.0) {
        dVar47 = 2.5198420997897464;
      }
      if (dVar1 <= dVar66) {
        dVar1 = dVar66;
      }
      dVar23 = cbrt(dVar50);
      dVar24 = cbrt(9.0);
      dVar67 = 1.0 / dVar23;
      dVar66 = (double)(~-(ulong)(2.0 <= dVar75) & 0x3ff0000000000000 |
                       (ulong)(1.2599210498948732 / dVar22) & -(ulong)(2.0 <= dVar75));
      dVar78 = dVar24 * dVar24 * dVar19 * dVar19 * p->cam_omega * 1.4422495703074083;
      dVar68 = (dVar67 * dVar78 * dVar66) / 18.0;
      dVar24 = 1.35;
      if (dVar68 <= 1.35) {
        dVar24 = dVar68;
      }
      dVar25 = erf((1.0 / dVar24) * 0.5);
      dVar52 = dVar24 * dVar24;
      dVar26 = exp((1.0 / dVar52) * -0.25);
      dVar120 = dVar68;
      if (dVar68 <= 1.35) {
        dVar120 = 1.35;
      }
      dVar104 = dVar120 * dVar120;
      dVar102 = dVar104 * dVar104;
      dVar79 = dVar102 * dVar102;
      auVar95._0_8_ = dVar79 * dVar79;
      auVar95._8_8_ = dVar79;
      auVar95 = divpd(_DAT_010020a0,auVar95);
      dVar97 = dVar52 * -2.0 * (dVar26 + -1.0) + dVar26 + -1.5;
      dVar25 = (dVar24 + dVar24) * dVar97 + dVar25 * 1.7724538509055159;
      dVar79 = auVar95._8_8_;
      if (dVar68 < 1.35) {
        dVar111 = dVar24 * -2.6666666666666665 * dVar25 + 1.0;
      }
      else {
        auVar48._0_8_ = dVar79 / (dVar104 * dVar102);
        auVar76._0_8_ = 1.0 / (dVar104 * dVar102);
        auVar87._8_8_ = dVar102;
        auVar87._0_8_ = dVar104;
        auVar114 = divpd(_DAT_010020a0,auVar87);
        auVar115 = divpd(auVar114,_DAT_01010a50);
        auVar76._8_8_ = dVar79;
        auVar76 = divpd(auVar76,_DAT_01010a60);
        auVar114._8_8_ = dVar79;
        auVar114._0_8_ = dVar79;
        auVar87 = divpd(auVar114,auVar87);
        auVar87 = divpd(auVar87,_DAT_01010a70);
        auVar48._8_8_ = auVar95._0_8_;
        auVar48 = divpd(auVar48,_DAT_01010a80);
        dVar111 = ((((((auVar115._0_8_ - auVar115._8_8_) + auVar76._0_8_) - auVar76._8_8_) +
                    auVar87._0_8_) - auVar87._8_8_) + auVar48._0_8_) - auVar48._8_8_;
      }
      dVar2 = pdVar9[1];
      dVar80 = dVar1 * dVar2;
      dVar125 = dVar50 * dVar50;
      dVar105 = 1.0 / (dVar23 * dVar23);
      dVar27 = dVar105 / dVar125;
      dVar116 = dVar27 * 1.5874010519681996;
      dVar53 = dVar1 * 1.5874010519681996 * dVar27;
      dVar121 = dVar53 * 0.004 + 1.0;
      dVar130 = dVar125 * dVar125;
      dVar28 = dVar121 * dVar121;
      dVar98 = dVar130 * dVar130;
      dVar132 = 1.0 / (dVar121 * dVar28);
      dVar131 = 1.0 / (dVar28 * dVar28);
      dVar126 = 1.0 / dVar121;
      dVar122 = dVar1 * dVar1;
      dVar3 = pdVar9[2];
      dVar54 = dVar122 * dVar3;
      dVar29 = (dVar67 / (dVar50 * dVar130)) * 1.2599210498948732;
      dVar128 = dVar29 * (1.0 / dVar28);
      dVar69 = dVar1 * dVar122;
      dVar4 = pdVar9[3];
      dVar90 = dVar69 * dVar4;
      dVar30 = 1.0 / dVar98;
      dVar117 = dVar30 * dVar132;
      dVar118 = dVar122 * dVar122;
      dVar5 = pdVar9[4];
      dVar91 = dVar118 * dVar5;
      dVar106 = (dVar105 / (dVar125 * dVar98)) * 1.5874010519681996;
      dVar107 = dVar106 * dVar131;
      dVar92 = dVar91 * 1.024e-09 * dVar107 +
               dVar90 * 2.56e-07 * dVar117 +
               dVar54 * 3.2e-05 * dVar128 + dVar80 * 0.004 * dVar116 * dVar126 + *pdVar9;
      dVar31 = dVar21 * 1.2599210498948732 * -0.046875 * dVar23 * dVar47;
      dVar81 = dVar111 * dVar92;
      dVar32 = 0.0;
      if (bVar11 && bVar10) {
        dVar32 = dVar31 * dVar81;
        dVar32 = dVar32 + dVar32;
      }
      local_5f0 = 1.0;
      if (1.0 <= dVar75) {
        local_5f0 = p->zeta_threshold;
      }
      uVar18 = -(ulong)(1.0 <= dVar75);
      dVar75 = (double)((ulong)(1.0 / dVar22) & uVar18 | ~uVar18 & 0x3ff0000000000000);
      dVar70 = dVar21 * dVar67;
      dVar71 = dVar70 * 1.2599210498948732 * dVar75;
      dVar82 = SQRT(dVar71);
      dVar22 = dVar82;
      if (dVar71 < 0.0) {
        dVar22 = sqrt(dVar71);
        dVar82 = sqrt(dVar71);
      }
      dVar33 = dVar71 * 0.053425 + 1.0;
      dVar82 = dVar82 * dVar71;
      dVar55 = dVar19 * dVar19 * 2.080083823051904 * 1.5874010519681996;
      dVar56 = dVar55 * dVar105;
      dVar57 = dVar56 * 1.5874010519681996 * dVar75 * dVar75;
      dVar58 = dVar57 * 0.123235 + dVar82 * 0.204775 + dVar22 * 3.79785 + dVar71 * 0.8969;
      __x = 16.081824322151103 / dVar58 + 1.0;
      dVar34 = log(__x);
      local_2f8 = 0.0;
      dVar35 = ((double)(-(ulong)(0.0 <= p->zeta_threshold) & (ulong)dVar51) + dVar47 + -2.0) *
               1.9236610509315362;
      dVar36 = dVar71 * 0.05137 + 1.0;
      dVar59 = dVar57 * 0.1562925 + dVar82 * 0.420775 + dVar22 * 7.05945 + dVar71 * 1.549425;
      __x_00 = 32.1646831778707 / dVar59 + 1.0;
      dVar37 = log(__x_00);
      dVar38 = dVar71 * 0.0278125 + 1.0;
      dVar60 = dVar57 * 0.1241775 + dVar82 * 0.1100325 + dVar22 * 5.1785 + dVar71 * 0.905775;
      dVar82 = 29.608574643216677 / dVar60 + 1.0;
      dVar57 = log(dVar82);
      if (bVar11 && bVar10) {
        dVar61 = dVar33 * 0.062182 * dVar34;
        local_2f8 = (dVar35 * 0.019751789702565206 * dVar38 * dVar57 +
                    ((dVar38 * dVar57 * -0.019751789702565206 + dVar36 * -0.03109 * dVar37 + dVar61)
                     * dVar35 - dVar61)) * local_5f0 * 0.5;
      }
      dVar61 = pdVar9[6];
      dVar6 = pdVar9[7];
      dVar103 = dVar1 * dVar61;
      dVar83 = dVar53 * 0.2 + 1.0;
      dVar108 = 1.0 / dVar83;
      dVar99 = dVar122 * dVar6;
      dVar7 = pdVar9[8];
      dVar84 = dVar69 * dVar7;
      dVar8 = pdVar9[9];
      dVar93 = dVar118 * dVar8;
      dVar41 = pdVar9[5];
      dVar112 = SQRT(dVar70);
      local_618 = dVar112;
      if (dVar70 < 0.0) {
        local_618 = sqrt(dVar70);
      }
      dVar39 = dVar83 * dVar83;
      dVar85 = dVar29 * (1.0 / dVar39);
      dVar109 = 1.0 / (dVar83 * dVar39);
      dVar94 = 1.0 / (dVar39 * dVar39);
      dVar40 = dVar30 * dVar109;
      dVar62 = dVar106 * dVar94;
      dVar100 = dVar93 * 0.0064 * dVar62 +
                dVar84 * 0.032 * dVar40 +
                dVar99 * 0.08 * dVar85 + dVar103 * 0.2 * dVar116 * dVar108 + dVar41;
      dVar41 = local_2f8 + local_2f8;
      dVar42 = dVar70 * 0.053425 + 1.0;
      if (dVar70 < 0.0) {
        dVar112 = sqrt(dVar70);
      }
      dVar63 = dVar56 * 0.123235 +
               dVar112 * dVar70 * 0.204775 + local_618 * 3.79785 + dVar70 * 0.8969;
      __x_01 = 16.081824322151103 / dVar63 + 1.0;
      dVar43 = log(__x_01);
      dVar51 = (double)(~uVar18 & 0x3ff0000000000000 | uVar18 & (ulong)dVar51);
      dVar72 = (dVar51 + dVar51 + -2.0) * 1.9236610509315362;
      dVar86 = dVar70 * 0.0278125 + 1.0;
      dVar73 = dVar56 * 0.1241775 +
               dVar112 * dVar70 * 0.1100325 + local_618 * 5.1785 + dVar70 * 0.905775;
      __x_02 = 29.608574643216677 / dVar73 + 1.0;
      dVar44 = log(__x_02);
      dVar51 = pdVar9[0xb];
      dVar56 = pdVar9[0xc];
      dVar119 = dVar1 * dVar51;
      dVar64 = dVar53 * 0.006 + 1.0;
      dVar127 = 1.0 / dVar64;
      dVar110 = dVar122 * dVar56;
      dVar45 = dVar64 * dVar64;
      dVar29 = dVar29 * (1.0 / dVar45);
      dVar53 = pdVar9[0xd];
      dVar113 = dVar69 * dVar53;
      dVar123 = 1.0 / (dVar64 * dVar45);
      dVar30 = dVar30 * dVar123;
      dVar112 = pdVar9[0xe];
      dVar129 = 1.0 / (dVar45 * dVar45);
      dVar74 = dVar118 * dVar112;
      dVar106 = dVar106 * dVar129;
      dVar116 = dVar74 * 5.184e-09 * dVar106 +
                dVar113 * 8.64e-07 * dVar30 +
                dVar110 * 7.2e-05 * dVar29 + dVar116 * dVar119 * 0.006 * dVar127 + pdVar9[10];
      dVar101 = (dVar42 * -0.062182 * dVar43 + dVar72 * 0.019751789702565206 * dVar86 * dVar44) -
                dVar41;
      dVar32 = dVar32 + dVar41 * dVar100 + dVar101 * dVar116;
      pdVar9 = out->zk;
      if ((pdVar9 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        lVar16 = (long)(p->dim).zk * sVar17;
        pdVar9[lVar16] = pdVar9[lVar16] + dVar32;
      }
      dVar46 = dVar67 / dVar50;
      dVar66 = (dVar78 * dVar46 * dVar66) / -54.0;
      if (dVar68 < 1.35) {
        dVar66 = (double)(~-(ulong)(1.35 < dVar68) & (ulong)dVar66);
        dVar66 = dVar66 * -2.6666666666666665 * dVar25 +
                 dVar24 * -2.6666666666666665 *
                 ((dVar24 + dVar24) *
                  (((dVar26 + -1.0) * dVar24 * -4.0 * dVar66 +
                   (1.0 / (dVar52 * dVar24)) * dVar66 * dVar26 * 0.5) -
                  (1.0 / dVar24) * dVar66 * dVar26) +
                 ((dVar66 + dVar66) * dVar97 - (1.0 / dVar52) * dVar26 * dVar66));
      }
      else {
        auVar65._0_8_ = dVar102 * dVar120;
        auVar65._8_8_ = dVar104 * dVar120;
        auVar48 = divpd(_DAT_010020a0,auVar65);
        auVar15._8_8_ = dVar79;
        auVar15._0_8_ = dVar79;
        auVar76 = divpd(auVar15,auVar65);
        dVar66 = (double)(-(ulong)(1.35 < dVar68) & (ulong)dVar66);
        auVar49._0_8_ = auVar48._0_8_ * dVar66;
        auVar49._8_8_ = auVar48._8_8_ * dVar66;
        auVar48 = divpd(auVar49,_DAT_01018bd0);
        auVar88._8_8_ = 0x3ff0000000000000;
        auVar88._0_8_ = dVar79;
        auVar115._8_8_ = auVar65._8_8_ * dVar102;
        auVar115._0_8_ = dVar120;
        auVar87 = divpd(auVar88,auVar115);
        auVar89._0_8_ = auVar87._0_8_ * dVar66;
        auVar89._8_8_ = auVar87._8_8_ * dVar66;
        auVar87 = divpd(auVar89,_DAT_01010aa0);
        auVar124._0_8_ = auVar76._0_8_ * dVar66;
        auVar124._8_8_ = auVar76._8_8_ * dVar66;
        auVar76 = divpd(auVar124,_DAT_01010ab0);
        auVar13._8_8_ = auVar65._8_8_ * dVar102;
        auVar13._0_8_ = dVar120;
        auVar95 = divpd(auVar95,auVar13);
        auVar96._0_8_ = auVar95._0_8_ * dVar66;
        auVar96._8_8_ = auVar95._8_8_ * dVar66;
        auVar95 = divpd(auVar96,_DAT_01010ac0);
        dVar66 = ((((((auVar48._0_8_ - auVar48._8_8_) - auVar87._8_8_) + auVar87._0_8_) -
                   auVar76._8_8_) + auVar76._0_8_) - auVar95._8_8_) + auVar95._0_8_;
      }
      dVar26 = (dVar105 / (dVar50 * dVar125)) * 1.5874010519681996;
      dVar78 = (dVar67 / (dVar130 * dVar125)) * 1.2599210498948732;
      dVar120 = 1.0 / (dVar50 * dVar98);
      dVar25 = dVar105 / (dVar50 * dVar125 * dVar98);
      dVar24 = dVar1 * dVar118;
      dVar67 = (1.2599210498948732 / dVar23) / (dVar130 * dVar125 * dVar98);
      dVar68 = 0.0;
      if (bVar11 && bVar10) {
        dVar52 = (1.0 / dVar28) * dVar78;
        dVar132 = dVar132 * dVar120;
        dVar68 = dVar131 * dVar25 * 1.5874010519681996;
        dVar68 = (dVar68 * dVar91 * -1.0922666666666667e-08 +
                  dVar118 * dVar4 * 8.192e-09 * dVar68 +
                  dVar132 * dVar90 * -2.048e-06 +
                  dVar69 * dVar3 * 1.3653333333333333e-06 * dVar132 +
                  dVar52 * dVar54 * -0.00017066666666666668 +
                  dVar80 * -0.010666666666666666 * dVar26 * dVar126 +
                  dVar122 * dVar2 * 8.533333333333334e-05 * dVar52 +
                 dVar67 * (dVar131 / dVar121) * dVar24 * dVar5 * 8.738133333333333e-11) * dVar111 *
                 dVar31 + dVar92 * dVar66 * dVar31 +
                          dVar47 * dVar105 * dVar21 * 1.2599210498948732 * dVar81 * -0.015625;
      }
      dVar47 = dVar46 * 2.519842099789747;
      if (dVar71 < 0.0) {
        dVar71 = sqrt(dVar71);
      }
      else {
        dVar71 = SQRT(dVar71);
      }
      dVar55 = dVar55 * (dVar105 / dVar50);
      dVar66 = 0.0;
      if (bVar11 && bVar10) {
        dVar28 = dVar75 * dVar75 * dVar55 * 1.5874010519681996;
        dVar66 = dVar47 * dVar75 * 1.2599210498948732;
        dVar79 = dVar19 * dVar71 * 1.4422495703074083 * dVar66;
        dVar66 = dVar19 * (1.0 / dVar22) * 1.4422495703074083 * dVar66;
        dVar22 = dVar46 * 1.2599210498948732;
        dVar97 = dVar75 * dVar22 * dVar21;
        dVar102 = dVar28 * -0.082785 +
                  dVar79 * -0.05501625 + dVar66 * -0.8630833333333333 + dVar97 * -0.301925;
        auVar77._8_8_ = dVar60 * dVar60;
        auVar77._0_8_ = dVar82;
        auVar95 = divpd(_DAT_010020a0,auVar77);
        auVar14._8_8_ = __x_00;
        auVar14._0_8_ = dVar59 * dVar59;
        auVar87 = divpd(_DAT_010020a0,auVar14);
        auVar12._8_8_ = __x;
        auVar12._0_8_ = dVar58 * dVar58;
        auVar48 = divpd(_DAT_010020a0,auVar12);
        dVar52 = (dVar28 * -0.08215666666666667 +
                 dVar79 * -0.1023875 + dVar66 * -0.632975 + dVar97 * -0.29896666666666666) *
                 auVar48._8_8_ * dVar33 * auVar48._0_8_;
        dVar104 = dVar34 * dVar75 * dVar21 * 0.0011073577833333333 * dVar22;
        dVar66 = local_5f0 *
                 (dVar38 * dVar35 * -0.5848223397455204 * auVar95._8_8_ * dVar102 * auVar95._0_8_ +
                 dVar20 * dVar35 * -0.0001831155503675316 * dVar47 *
                 dVar75 * 1.2599210498948732 * dVar57 +
                 (auVar95._8_8_ * dVar38 * 0.5848223397455204 * auVar95._0_8_ * dVar102 +
                 dVar21 * 0.0001831155503675316 * dVar22 * dVar57 * dVar75 +
                 ((((dVar28 * -0.104195 +
                    dVar79 * -0.2103875 + dVar66 * -1.176575 + dVar97 * -0.516475) * auVar87._8_8_ *
                    dVar36 * auVar87._0_8_ +
                   dVar21 * 0.0005323644333333333 * dVar22 * dVar37 * dVar75) - dVar104) - dVar52))
                 * dVar35 + dVar104 + dVar52) * 0.5;
      }
      dVar75 = dVar25 * dVar94 * 1.5874010519681996;
      dVar22 = dVar19 * 2.519842099789747 * dVar46;
      dVar21 = (1.0 / local_618) * 1.4422495703074083 * dVar22;
      if (dVar70 < 0.0) {
        dVar70 = sqrt(dVar70);
      }
      else {
        dVar70 = SQRT(dVar70);
      }
      dVar22 = dVar22 * dVar70 * 1.4422495703074083;
      dVar25 = dVar25 * dVar129 * 1.5874010519681996;
      pdVar9 = out->vrho;
      if ((pdVar9 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        dVar52 = (1.0 / dVar39) * dVar78;
        dVar109 = dVar109 * dVar120;
        local_2f8 = local_2f8 *
                    (dVar93 * -0.06826666666666667 * dVar75 +
                     dVar118 * dVar7 * 0.0512 * dVar75 +
                     dVar84 * -0.256 * dVar109 +
                     dVar69 * dVar6 * 0.17066666666666666 * dVar109 +
                     dVar99 * -0.4266666666666667 * dVar52 +
                     dVar103 * -0.5333333333333333 * dVar26 * dVar108 +
                     dVar122 * dVar61 * 0.21333333333333335 * dVar52 +
                    dVar24 * dVar8 * 0.027306666666666667 * dVar67 * (dVar94 / dVar83));
        dVar100 = dVar100 * dVar66;
        dVar78 = (1.0 / dVar45) * dVar78;
        dVar123 = dVar123 * dVar120;
        lVar16 = (long)(p->dim).vrho * sVar17;
        pdVar9[lVar16] =
             (local_2f8 + local_2f8 + dVar68 + dVar68 + dVar100 + dVar100 +
              dVar116 * ((dVar46 * dVar19 * 2.519842099789747 *
                                   dVar72 * 1.4422495703074083 * -0.0001831155503675316 * dVar44 +
                          dVar20 * 0.0011073577833333333 * dVar47 * dVar43 +
                          (1.0 / __x_01) *
                          (dVar55 * -0.08215666666666667 +
                          dVar22 * -0.1023875 +
                          dVar21 * -0.632975 + dVar20 * dVar47 * -0.29896666666666666) *
                          dVar42 * (1.0 / (dVar63 * dVar63)) +
                         dVar86 * dVar72 * -0.5848223397455204 *
                         (1.0 / __x_02) *
                         (dVar55 * -0.082785 +
                         dVar22 * -0.05501625 +
                         dVar21 * -0.8630833333333333 + dVar20 * dVar47 * -0.301925) *
                         (1.0 / (dVar73 * dVar73))) - (dVar66 + dVar66)) +
             (dVar74 * -5.5296e-08 * dVar25 +
              dVar118 * dVar53 * 4.1472e-08 * dVar25 +
              dVar113 * -6.912e-06 * dVar123 +
              dVar69 * dVar56 * 4.608e-06 * dVar123 +
              dVar110 * -0.000384 * dVar78 +
              dVar119 * -0.016 * dVar26 * dVar127 + dVar122 * dVar51 * 0.000192 * dVar78 +
             dVar24 * dVar112 * 6.63552e-10 * dVar67 * (dVar129 / dVar64)) * dVar101) * dVar50 +
             dVar32 + pdVar9[lVar16];
      }
      dVar75 = (1.2599210498948732 / dVar23) / (dVar98 * dVar50 * dVar130);
      dVar47 = 0.0;
      if (bVar11 && bVar10) {
        dVar31 = dVar31 * dVar111 * (dVar5 * dVar69 * 4.096e-09 * dVar107 +
                                     dVar90 * -3.072e-09 * dVar107 +
                                     dVar4 * dVar122 * 7.68e-07 * dVar117 +
                                     dVar54 * -5.12e-07 * dVar117 +
                                     dVar3 * dVar1 * 6.4e-05 * dVar128 +
                                     dVar2 * 1.5874010519681996 * 0.004 * dVar27 * dVar126 +
                                     dVar80 * -3.2e-05 * dVar128 +
                                    (dVar131 / dVar121) * dVar75 * dVar91 * -3.2768e-11);
        dVar47 = dVar31 + dVar31;
      }
      pdVar9 = out->vsigma;
      if ((pdVar9 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar16 = (long)(p->dim).vsigma * sVar17;
        pdVar9[lVar16] =
             dVar50 * (dVar101 * (dVar112 * dVar69 * 2.0736e-08 * dVar106 +
                                  dVar113 * -1.5552e-08 * dVar106 +
                                  dVar53 * dVar122 * 2.592e-06 * dVar30 +
                                  dVar110 * -1.728e-06 * dVar30 +
                                  dVar56 * dVar1 * 0.000144 * dVar29 +
                                  dVar51 * 1.5874010519681996 * 0.006 * dVar27 * dVar127 +
                                  dVar119 * -7.2e-05 * dVar29 +
                                 dVar74 * -2.48832e-10 * (dVar129 / dVar64) * dVar75) +
                      dVar41 * (dVar8 * dVar69 * 0.0256 * dVar62 +
                                dVar84 * -0.0192 * dVar62 +
                                dVar7 * dVar122 * 0.096 * dVar40 +
                                dVar99 * -0.064 * dVar40 +
                                dVar6 * dVar1 * 0.16 * dVar85 +
                                dVar61 * 1.5874010519681996 * 0.2 * dVar27 * dVar108 +
                                dVar103 * -0.08 * dVar85 +
                               dVar93 * -0.01024 * (dVar94 / dVar83) * dVar75) + dVar47) +
             pdVar9[lVar16];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}